

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageChannel.cpp
# Opt level: O1

void __thiscall
Imf_3_4::TypedDeepImageChannel<unsigned_int>::moveSamplesToNewBuffer
          (TypedDeepImageChannel<unsigned_int> *this,uint *oldNumSamples,uint *newNumSamples,
          size_t *newSampleListPositions)

{
  uint *puVar1;
  Vec2<int> VVar2;
  size_t sVar3;
  uint **ppuVar4;
  uint *puVar5;
  size_t sVar6;
  uint *puVar7;
  ulong uVar8;
  ulong uVar9;
  
  puVar1 = this->_sampleBuffer;
  VVar2 = (this->super_DeepImageChannel).super_ImageChannel._level[4]._dataWindow.min;
  puVar5 = (uint *)operator_new__(-(ulong)((ulong)VVar2 >> 0x3e != 0) | (long)VVar2 << 2);
  this->_sampleBuffer = puVar5;
  sVar3 = (this->super_DeepImageChannel).super_ImageChannel._numPixels;
  if (sVar3 != 0) {
    sVar6 = 0;
    do {
      ppuVar4 = this->_sampleListPointers;
      puVar7 = this->_sampleBuffer + newSampleListPositions[sVar6];
      puVar5 = ppuVar4[sVar6];
      if (newNumSamples[sVar6] < oldNumSamples[sVar6]) {
        if (newNumSamples[sVar6] != 0) {
          uVar8 = 0;
          do {
            puVar7[uVar8] = puVar5[uVar8];
            uVar8 = uVar8 + 1;
          } while (uVar8 < newNumSamples[sVar6]);
        }
      }
      else {
        uVar8 = (ulong)oldNumSamples[sVar6];
        if (oldNumSamples[sVar6] != 0) {
          uVar9 = 0;
          do {
            puVar7[uVar9] = puVar5[uVar9];
            uVar9 = uVar9 + 1;
            uVar8 = (ulong)oldNumSamples[sVar6];
          } while (uVar9 < uVar8);
        }
        if ((uint)uVar8 < newNumSamples[sVar6]) {
          do {
            puVar7[uVar8] = 0;
            uVar8 = uVar8 + 1;
          } while (uVar8 < newNumSamples[sVar6]);
        }
      }
      ppuVar4[sVar6] = puVar7;
      sVar6 = sVar6 + 1;
    } while (sVar6 != sVar3);
  }
  if (puVar1 == (uint *)0x0) {
    return;
  }
  operator_delete__(puVar1);
  return;
}

Assistant:

void
TypedDeepImageChannel<T>::moveSamplesToNewBuffer (
    const unsigned int* oldNumSamples,
    const unsigned int* newNumSamples,
    const size_t*       newSampleListPositions)
{
    //
    // Allocate a new sample buffer for this channel.
    // Copy the sample lists for all pixels into the new buffer.
    // Then delete the old sample buffer.
    //
    // oldNumSamples            Number of samples in each sample list in the
    //                          old sample buffer.
    //
    // newNumSamples            Number of samples in each sample list in
    //                          the new sample buffer.  If the new number
    //                          of samples is larger than the old number of
    //                          samples for a given sample list, then the
    //                          end of the new sample list is filled with
    //                          zeroes.  If the new number of samples is
    //                          smaller than the old one, then samples at
    //                          the end of the old sample list are discarded.
    //
    // newSampleListPositions   The positions of the new sample lists in the
    //                          new sample buffer.
    //

    T* oldSampleBuffer = _sampleBuffer;
    _sampleBuffer      = new T[sampleCounts ().sampleBufferSize ()];

    for (size_t i = 0; i < numPixels (); ++i)
    {
        T* oldSampleList = _sampleListPointers[i];
        T* newSampleList = _sampleBuffer + newSampleListPositions[i];

        if (oldNumSamples[i] > newNumSamples[i])
        {
            for (unsigned int j = 0; j < newNumSamples[i]; ++j)
                newSampleList[j] = oldSampleList[j];
        }
        else
        {
            for (unsigned int j = 0; j < oldNumSamples[i]; ++j)
                newSampleList[j] = oldSampleList[j];

            for (unsigned int j = oldNumSamples[i]; j < newNumSamples[i]; ++j)
                newSampleList[j] = 0;
        }

        _sampleListPointers[i] = newSampleList;
    }

    delete[] oldSampleBuffer;
}